

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLoadUnstructuredPoints.hpp
# Opt level: O0

void TasGrid::loadUnstructuredDataL2
               (vector<double,_std::allocator<double>_> *data_points,
               vector<double,_std::allocator<double>_> *model_values,double tolerance,
               TasmanianSparseGrid *grid)

{
  bool bVar1;
  int iVar2;
  int b;
  size_type sVar3;
  size_t sVar4;
  runtime_error *prVar5;
  double *data_points_00;
  double *model_values_00;
  int num_data;
  TasmanianSparseGrid *grid_local;
  double tolerance_local;
  vector<double,_std::allocator<double>_> *model_values_local;
  vector<double,_std::allocator<double>_> *data_points_local;
  
  bVar1 = TasmanianSparseGrid::empty(grid);
  if (bVar1) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,"Cannot use loadUnstructuredDataL2() with an empty grid.");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3 = std::vector<double,_std::allocator<double>_>::size(data_points);
  iVar2 = TasmanianSparseGrid::getNumDimensions(grid);
  iVar2 = (int)(sVar3 / (ulong)(long)iVar2);
  sVar3 = std::vector<double,_std::allocator<double>_>::size(model_values);
  b = TasmanianSparseGrid::getNumOutputs(grid);
  sVar4 = Utils::size_mult<int,int>(iVar2,b);
  if (sVar3 < sVar4) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar5,"In loadUnstructuredDataL2(), provided more points than data.");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  data_points_00 = std::vector<double,_std::allocator<double>_>::data(data_points);
  model_values_00 = std::vector<double,_std::allocator<double>_>::data(model_values);
  loadUnstructuredDataL2(data_points_00,iVar2,model_values_00,tolerance,grid);
  return;
}

Assistant:

inline void loadUnstructuredDataL2(std::vector<double> const &data_points, std::vector<double> const &model_values,
                                   double tolerance, TasmanianSparseGrid &grid){
    if (grid.empty()) throw std::runtime_error("Cannot use loadUnstructuredDataL2() with an empty grid.");
    int num_data = static_cast<int>(data_points.size() / grid.getNumDimensions());
    if (model_values.size() < Utils::size_mult(num_data, grid.getNumOutputs()))
        throw std::runtime_error("In loadUnstructuredDataL2(), provided more points than data.");
    loadUnstructuredDataL2(data_points.data(), num_data, model_values.data(), tolerance, grid);
}